

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XBM_Image.cxx
# Opt level: O3

void __thiscall Fl_XBM_Image::Fl_XBM_Image(Fl_XBM_Image *this,char *name)

{
  uchar **ppuVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  uchar *puVar7;
  int *piVar8;
  bool bVar9;
  int iVar10;
  uint t;
  int wh [2];
  char buffer [1024];
  char junk [1024];
  uchar local_84c [4];
  int local_848;
  int local_844;
  uchar **local_840;
  char local_838;
  undefined2 uStack_837;
  int iStack_835;
  undefined1 local_438 [1032];
  
  Fl_Image::Fl_Image((Fl_Image *)this,0,0,0);
  ppuVar1 = &(this->super_Fl_Bitmap).array;
  (this->super_Fl_Bitmap).array = (uchar *)0x0;
  (this->super_Fl_Bitmap).alloc_array = 0;
  (this->super_Fl_Bitmap).id_ = 0;
  (this->super_Fl_Bitmap).super_Fl_Image.data_ = (char **)ppuVar1;
  (this->super_Fl_Bitmap).super_Fl_Image.count_ = 1;
  (this->super_Fl_Bitmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Bitmap_0027a0d8;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    piVar8 = &local_848;
    bVar3 = true;
    local_840 = ppuVar1;
    do {
      do {
        bVar9 = bVar3;
        pcVar6 = fgets(&local_838,0x400,__stream);
        if (pcVar6 == (char *)0x0) goto LAB_001de1f7;
        iVar4 = __isoc99_sscanf(&local_838,"#define %s %d",local_438,piVar8);
        bVar3 = bVar9;
      } while (iVar4 < 2);
      piVar8 = &local_844;
      bVar3 = false;
    } while (bVar9);
    do {
      pcVar6 = fgets(&local_838,0x400,__stream);
      if (pcVar6 == (char *)0x0) goto LAB_001de1f7;
    } while (iStack_835 != 0x20636974 ||
             CONCAT13((undefined1)iStack_835,CONCAT21(uStack_837,local_838)) != 0x74617473);
    (this->super_Fl_Bitmap).super_Fl_Image.w_ = local_848;
    iVar4 = local_848 + 0xe;
    if (-1 < local_848 + 7) {
      iVar4 = local_848 + 7;
    }
    (this->super_Fl_Bitmap).super_Fl_Image.h_ = local_844;
    iVar4 = (iVar4 >> 3) * local_844;
    puVar7 = (uchar *)operator_new__((long)iVar4);
    *local_840 = puVar7;
    if (0 < iVar4) {
      iVar10 = 0;
      do {
        pcVar6 = fgets(&local_838,0x400,__stream);
        if (pcVar6 == (char *)0x0) break;
        if ((local_838 != '\0') && (iVar10 < iVar4)) {
          pcVar6 = &local_838;
          do {
            iVar5 = __isoc99_sscanf(pcVar6," 0x%x",local_84c);
            if (0 < iVar5) {
              *puVar7 = local_84c[0];
              puVar7 = puVar7 + 1;
              iVar10 = iVar10 + 1;
            }
            do {
              cVar2 = *pcVar6;
              if (cVar2 == '\0') break;
              pcVar6 = pcVar6 + 1;
            } while (cVar2 != ',');
          } while ((*pcVar6 != '\0') && (iVar10 < iVar4));
        }
      } while (iVar10 < iVar4);
    }
LAB_001de1f7:
    fclose(__stream);
  }
  return;
}

Assistant:

Fl_XBM_Image::Fl_XBM_Image(const char *name) : Fl_Bitmap((const char *)0,0,0) {
  FILE	*f;
  uchar	*ptr;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  char buffer[1024];
  char junk[1024];
  int wh[2]; // width and height
  int i;
  for (i = 0; i<2; i++) {
    for (;;) {
      if (!fgets(buffer,1024,f)) {
        fclose(f);
	return;
      }
      int r = sscanf(buffer,"#define %s %d",junk,&wh[i]);
      if (r >= 2) break;
    }
  }

  // skip to data array:
  for (;;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    if (!strncmp(buffer,"static ",7)) break;
  }

  // Allocate memory...
  w(wh[0]);
  h(wh[1]);

  int n = ((wh[0]+7)/8)*wh[1];
  array = new uchar[n];

  // read the data:
  for (i = 0, ptr = (uchar *)array; i < n;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    const char *a = buffer;
    while (*a && i<n) {
      unsigned int t;
      if (sscanf(a," 0x%x",&t)>0) {
        *ptr++ = (uchar)t;
	i ++;
      }
      while (*a && *a++ != ',') {/*empty*/}
    }
  }

  fclose(f);
}